

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScalar.h
# Opt level: O0

btScalar btAtan2Fast(btScalar y,btScalar x)

{
  btScalar in_XMM0_Da;
  btScalar bVar1;
  float in_XMM1_Da;
  btScalar r_1;
  btScalar r;
  btScalar angle;
  btScalar abs_y;
  btScalar coeff_2;
  btScalar coeff_1;
  undefined4 local_24;
  undefined4 local_18;
  
  bVar1 = btFabs(in_XMM0_Da);
  if (in_XMM1_Da < 0.0) {
    local_18 = ((in_XMM1_Da + bVar1) / (bVar1 - in_XMM1_Da)) * -0.7853982 + 2.3561945;
  }
  else {
    local_18 = ((in_XMM1_Da - bVar1) / (in_XMM1_Da + bVar1)) * -0.7853982 + 0.7853982;
  }
  if (0.0 <= in_XMM0_Da) {
    local_24 = local_18;
  }
  else {
    local_24 = -local_18;
  }
  return local_24;
}

Assistant:

SIMD_FORCE_INLINE btScalar btAtan2Fast(btScalar y, btScalar x) 
{
	btScalar coeff_1 = SIMD_PI / 4.0f;
	btScalar coeff_2 = 3.0f * coeff_1;
	btScalar abs_y = btFabs(y);
	btScalar angle;
	if (x >= 0.0f) {
		btScalar r = (x - abs_y) / (x + abs_y);
		angle = coeff_1 - coeff_1 * r;
	} else {
		btScalar r = (x + abs_y) / (abs_y - x);
		angle = coeff_2 - coeff_1 * r;
	}
	return (y < 0.0f) ? -angle : angle;
}